

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O1

ngx_int_t ngx_http_charset_postconfiguration(ngx_conf_t *cf)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  long *plVar9;
  long lVar10;
  long *plVar11;
  
  plVar2 = *(long **)(*cf->ctx + ngx_http_charset_filter_module.ctx_index * 8);
  lVar3 = *plVar2;
  plVar11 = (long *)plVar2[5];
  if (plVar2[0xb] != 0) {
    lVar8 = 0;
    do {
      lVar1 = plVar2[10] + lVar8 * 0x10;
      lVar4 = *(long *)(plVar2[10] + lVar8 * 0x10);
      lVar10 = plVar2[6];
      plVar9 = plVar11 + 1;
      while( true ) {
        if (lVar10 == 0) {
          if (cf->log->log_level != 0) {
            ngx_log_error_core(1,cf->log,0,
                               "no \"charset_map\" between the charsets \"%V\" and \"%V\"",
                               lVar4 * 0x20 + lVar3 + 8,lVar3 + *(long *)(lVar1 + 8) * 0x20 + 8);
            return -1;
          }
          return -1;
        }
        if (((lVar4 == plVar9[-1]) && (*(long *)(lVar1 + 8) == *plVar9)) ||
           ((lVar4 == *plVar9 && (*(long *)(lVar1 + 8) == plVar9[-1])))) break;
        plVar9 = plVar9 + 4;
        lVar10 = lVar10 + -1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != plVar2[0xb]);
  }
  if (plVar2[6] != 0) {
    uVar7 = 0;
    do {
      pvVar5 = *(void **)(lVar3 + *plVar11 * 0x20);
      if (pvVar5 == (void *)0x0) {
        pvVar5 = ngx_pcalloc(cf->pool,plVar2[1] << 3);
        if (pvVar5 == (void *)0x0) {
          return -1;
        }
        *(void **)(lVar3 + *plVar11 * 0x20) = pvVar5;
      }
      pvVar6 = *(void **)(lVar3 + plVar11[1] * 0x20);
      if (pvVar6 == (void *)0x0) {
        pvVar6 = ngx_pcalloc(cf->pool,plVar2[1] << 3);
        if (pvVar6 == (void *)0x0) {
          return -1;
        }
        *(void **)(lVar3 + plVar11[1] * 0x20) = pvVar6;
      }
      *(long *)((long)pvVar5 + plVar11[1] * 8) = plVar11[2];
      *(long *)((long)pvVar6 + *plVar11 * 8) = plVar11[3];
      uVar7 = uVar7 + 1;
      plVar11 = plVar11 + 4;
    } while (uVar7 < (ulong)plVar2[6]);
  }
  ngx_http_next_body_filter = ngx_http_top_body_filter;
  ngx_http_next_header_filter = ngx_http_top_header_filter;
  ngx_http_top_header_filter = ngx_http_charset_header_filter;
  ngx_http_top_body_filter = ngx_http_charset_body_filter;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_charset_postconfiguration(ngx_conf_t *cf)
{
    u_char                       **src, **dst;
    ngx_int_t                      c;
    ngx_uint_t                     i, t;
    ngx_http_charset_t            *charset;
    ngx_http_charset_recode_t     *recode;
    ngx_http_charset_tables_t     *tables;
    ngx_http_charset_main_conf_t  *mcf;

    mcf = ngx_http_conf_get_module_main_conf(cf,
                                             ngx_http_charset_filter_module);

    recode = mcf->recodes.elts;
    tables = mcf->tables.elts;
    charset = mcf->charsets.elts;

    for (i = 0; i < mcf->recodes.nelts; i++) {

        c = recode[i].src;

        for (t = 0; t < mcf->tables.nelts; t++) {

            if (c == tables[t].src && recode[i].dst == tables[t].dst) {
                goto next;
            }

            if (c == tables[t].dst && recode[i].dst == tables[t].src) {
                goto next;
            }
        }

        ngx_log_error(NGX_LOG_EMERG, cf->log, 0,
                   "no \"charset_map\" between the charsets \"%V\" and \"%V\"",
                   &charset[c].name, &charset[recode[i].dst].name);
        return NGX_ERROR;

    next:
        continue;
    }


    for (t = 0; t < mcf->tables.nelts; t++) {

        src = charset[tables[t].src].tables;

        if (src == NULL) {
            src = ngx_pcalloc(cf->pool, sizeof(u_char *) * mcf->charsets.nelts);
            if (src == NULL) {
                return NGX_ERROR;
            }

            charset[tables[t].src].tables = src;
        }

        dst = charset[tables[t].dst].tables;

        if (dst == NULL) {
            dst = ngx_pcalloc(cf->pool, sizeof(u_char *) * mcf->charsets.nelts);
            if (dst == NULL) {
                return NGX_ERROR;
            }

            charset[tables[t].dst].tables = dst;
        }

        src[tables[t].dst] = tables[t].src2dst;
        dst[tables[t].src] = tables[t].dst2src;
    }

    ngx_http_next_header_filter = ngx_http_top_header_filter;
    ngx_http_top_header_filter = ngx_http_charset_header_filter;

    ngx_http_next_body_filter = ngx_http_top_body_filter;
    ngx_http_top_body_filter = ngx_http_charset_body_filter;

    return NGX_OK;
}